

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_trainFromBuffer
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples)

{
  size_t sVar1;
  ZDICT_fastCover_params_t params;
  ZDICT_fastCover_params_t *in_stack_000001a0;
  uint in_stack_000001ac;
  size_t *in_stack_000001b0;
  void *in_stack_000001b8;
  size_t in_stack_000001c0;
  void *in_stack_000001c8;
  undefined1 local_60 [4];
  undefined4 local_5c;
  undefined4 local_54;
  undefined4 local_34;
  
  memset(local_60,0,0x38);
  local_5c = 8;
  local_54 = 4;
  local_34 = 3;
  sVar1 = ZDICT_optimizeTrainFromBuffer_fastCover
                    (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                     in_stack_000001ac,in_stack_000001a0);
  return sVar1;
}

Assistant:

size_t ZDICT_trainFromBuffer(void* dictBuffer, size_t dictBufferCapacity,
                             const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples)
{
    ZDICT_fastCover_params_t params;
    DEBUGLOG(3, "ZDICT_trainFromBuffer");
    memset(&params, 0, sizeof(params));
    params.d = 8;
    params.steps = 4;
    /* Use default level since no compression level information is available */
    params.zParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;
#if defined(DEBUGLEVEL) && (DEBUGLEVEL>=1)
    params.zParams.notificationLevel = DEBUGLEVEL;
#endif
    return ZDICT_optimizeTrainFromBuffer_fastCover(dictBuffer, dictBufferCapacity,
                                               samplesBuffer, samplesSizes, nbSamples,
                                               &params);
}